

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O2

shared_ptr<asio::io_context::strand> __thiscall
tonk::MakeSharedNoThrow<asio::io_context::strand,asio::io_context&>(tonk *this,io_context *args)

{
  strand *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<asio::io_context::strand> sVar1;
  
  this_00 = (strand *)operator_new(0x10,(nothrow_t *)&std::nothrow);
  if (this_00 != (strand *)0x0) {
    asio::io_context::strand::strand(this_00,args);
  }
  std::__shared_ptr<asio::io_context::strand,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<asio::io_context::strand,void>
            ((__shared_ptr<asio::io_context::strand,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  sVar1.super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<asio::io_context::strand>)
         sVar1.super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<T> MakeSharedNoThrow(Args&&... args) {
    return std::shared_ptr<T>(new(std::nothrow) T(std::forward<Args>(args)...));
}